

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_3::ButtonBase::~ButtonBase(ButtonBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__ButtonBase_00174e18;
  p_Var2 = (this->on_click_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->on_click_,(_Any_data *)&this->on_click_,__destroy_functor);
  }
  pcVar3 = (this->label_).owned_._M_dataplus._M_p;
  paVar1 = &(this->label_).owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  operator_delete(this,0x90);
  return;
}

Assistant:

ButtonBase(ConstStringRef label,
             std::function<void()> on_click,
             Ref<ButtonOption> option)
      : label_(label), on_click_(on_click), option_(std::move(option)) {}